

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O1

int ECDSA_sign(int type,uchar *dgst,int dgstlen,uchar *sig,uint *siglen,EC_KEY *eckey)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ECDSA_SIG *sig_00;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  size_t len;
  size_t fixed_len;
  CBB cbb;
  uint8_t fixed [132];
  uint local_e8 [2];
  size_t local_e0;
  CBB local_d8;
  uint8_t local_a8 [136];
  
  if ((*(long *)(eckey + 0x28) != 0) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)(eckey + 0x28) + 0x20),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(dgst,CONCAT44(in_register_00000014,dgstlen),sig,siglen,eckey);
    return iVar1;
  }
  *siglen = 0;
  iVar1 = ecdsa_sign_fixed(dgst,CONCAT44(in_register_00000014,dgstlen),local_a8,&local_e0,0x84,
                           (EC_KEY *)eckey);
  if (iVar1 != 0) {
    sig_00 = (ECDSA_SIG *)ecdsa_sig_from_fixed((EC_KEY *)eckey,local_a8,local_e0);
    if (sig_00 == (ECDSA_SIG *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = ECDSA_size(eckey);
      CBB_init_fixed(&local_d8,sig,CONCAT44(extraout_var,iVar1));
      iVar1 = ECDSA_SIG_marshal(&local_d8,(ECDSA_SIG *)sig_00);
      if ((iVar1 == 0) ||
         (iVar1 = CBB_finish(&local_d8,(uint8_t **)0x0,(size_t *)local_e8), iVar1 == 0)) {
        iVar1 = 0;
        ERR_put_error(0x1a,0,0x69,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                      ,100);
      }
      else {
        *siglen = local_e8[0];
        iVar1 = 1;
      }
    }
    if (sig_00 != (ECDSA_SIG *)0x0) {
      ECDSA_SIG_free(sig_00);
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int ECDSA_sign(int type, const uint8_t *digest, size_t digest_len, uint8_t *sig,
               unsigned int *out_sig_len, const EC_KEY *eckey) {
  if (eckey->ecdsa_meth && eckey->ecdsa_meth->sign) {
    return eckey->ecdsa_meth->sign(digest, digest_len, sig, out_sig_len,
                                   (EC_KEY *)eckey /* cast away const */);
  }

  *out_sig_len = 0;
  uint8_t fixed[ECDSA_MAX_FIXED_LEN];
  size_t fixed_len;
  if (!ecdsa_sign_fixed(digest, digest_len, fixed, &fixed_len, sizeof(fixed),
                        eckey)) {
    return 0;
  }

  // TODO(davidben): We can actually do better and go straight from the DER
  // format to the fixed-width format without a malloc.
  bssl::UniquePtr<ECDSA_SIG> s(ecdsa_sig_from_fixed(eckey, fixed, fixed_len));
  if (s == nullptr) {
    return 0;
  }

  CBB cbb;
  CBB_init_fixed(&cbb, sig, ECDSA_size(eckey));
  size_t len;
  if (!ECDSA_SIG_marshal(&cbb, s.get()) || !CBB_finish(&cbb, nullptr, &len)) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_ENCODE_ERROR);
    return 0;
  }
  *out_sig_len = static_cast<unsigned>(len);
  return 1;
}